

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O3

void beltHMACStart(void *state,octet *key,size_t len)

{
  u32 *dest;
  u32 *X;
  void *stack;
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  octet *poVar7;
  size_t count;
  
  if (len < 0x21) {
    memCopy((void *)((long)state + 0xd0),key,len);
    memSet((void *)((long)state + len + 0xd0),'\0',0x20 - len);
  }
  else {
    *(undefined8 *)state = 0;
    *(undefined8 *)((long)state + 8) = 0;
    beltBlockAddBitSizeU32((u32 *)state,len);
    dest = (u32 *)((long)state + 0x20);
    *(undefined8 *)((long)state + 0x10) = 0;
    *(undefined8 *)((long)state + 0x18) = 0;
    lVar6 = 0;
    poVar7 = beltH();
    u32From(dest,poVar7,0x20);
    X = (u32 *)((long)state + 0xd0);
    stack = (void *)((long)state + 0xf8);
    count = len;
    do {
      *(undefined8 *)((long)state + 0xd0) = *(undefined8 *)(key + lVar6);
      *(undefined8 *)((long)state + 0xd8) = *(undefined8 *)(key + lVar6 + 8);
      *(undefined8 *)((long)state + 0xe0) = *(undefined8 *)(key + lVar6 + 0x10);
      *(undefined8 *)((long)state + 0xe8) = *(undefined8 *)(key + lVar6 + 0x18);
      beltCompr2((u32 *)((long)state + 0x10),dest,X,stack);
      count = count - 0x20;
      lVar6 = lVar6 + 0x20;
    } while (0x1f < count);
    if (lVar6 - len != 0) {
      memCopy(X,key + lVar6,count);
      memSet((void *)((long)state + (len - lVar6) + 0xd0),'\0',(lVar6 - len) + 0x20);
      beltCompr2((u32 *)((long)state + 0x10),dest,X,stack);
    }
    beltCompr(dest,(u32 *)state,stack);
    *(undefined8 *)((long)state + 0xd0) = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)state + 0xd8) = *(undefined8 *)((long)state + 0x28);
    *(undefined8 *)((long)state + 0xe0) = *(undefined8 *)((long)state + 0x30);
    *(undefined8 *)((long)state + 0xe8) = *(undefined8 *)((long)state + 0x38);
  }
  lVar6 = 0xd0;
  do {
    puVar1 = (uint *)((long)state + lVar6);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (uint *)((long)state + lVar6);
    *puVar2 = *puVar1 ^ 0x36363636;
    puVar2[1] = uVar3 ^ 0x36363636;
    puVar2[2] = uVar4 ^ 0x36363636;
    puVar2[3] = uVar5 ^ 0x36363636;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0xf0);
  *(undefined8 *)state = 0;
  *(undefined8 *)((long)state + 8) = 0;
  beltBlockAddBitSizeU32((u32 *)state,0x20);
  *(undefined8 *)((long)state + 0x10) = 0;
  *(undefined8 *)((long)state + 0x18) = 0;
  poVar7 = beltH();
  u32From((u32 *)((long)state + 0x20),poVar7,0x20);
  beltCompr2((u32 *)((long)state + 0x10),(u32 *)((long)state + 0x20),(u32 *)((long)state + 0xd0),
             (void *)((long)state + 0xf8));
  *(undefined8 *)((long)state + 0xf0) = 0;
  *(uint *)((long)state + 0xe0) = *(uint *)((long)state + 0xe0) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xe4) = *(uint *)((long)state + 0xe4) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xe8) = *(uint *)((long)state + 0xe8) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xec) = *(uint *)((long)state + 0xec) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xd0) = *(uint *)((long)state + 0xd0) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xd4) = *(uint *)((long)state + 0xd4) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xd8) = *(uint *)((long)state + 0xd8) ^ 0x6a6a6a6a;
  *(uint *)((long)state + 0xdc) = *(uint *)((long)state + 0xdc) ^ 0x6a6a6a6a;
  *(undefined8 *)((long)state + 0x60) = 0;
  *(undefined8 *)((long)state + 0x68) = 0;
  beltBlockAddBitSizeU32((u32 *)((long)state + 0x60),0x40);
  *(undefined8 *)((long)state + 0x70) = 0;
  *(undefined8 *)((long)state + 0x78) = 0;
  poVar7 = beltH();
  u32From((u32 *)((long)state + 0x80),poVar7,0x20);
  beltCompr2((u32 *)((long)state + 0x70),(u32 *)((long)state + 0x80),(u32 *)((long)state + 0xd0),
             (void *)((long)state + 0xf8));
  return;
}

Assistant:

void beltHMACStart(void* state, const octet key[], size_t len)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	ASSERT(memIsDisjoint2(key, len, state, beltHMAC_keep()));
	// key <- key || 0
	if (len <= 32)
	{
		memCopy(st->block, key, len);
		memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
	}
	// key <- beltHash(key)
	else
	{
		beltBlockSetZero(st->ls_in);
		beltBlockAddBitSizeU32(st->ls_in, len);
		beltBlockSetZero(st->ls_in + 4);
		u32From(st->h_in, beltH(), 32);
		while (len >= 32)
		{
			beltBlockCopy(st->block, key);
			beltBlockCopy(st->block + 16, key + 16);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
			key += 32;
			len -= 32;
		}
		if (len)
		{
			memCopy(st->block, key, len);
			memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
		}
		beltCompr(st->h_in, st->ls_in, st->stack);
		beltBlockCopy(st->block, st->h_in);
		beltBlockCopy(st->block + 16, st->h_in + 4);
	}
	// сформировать key ^ ipad
	for (len = 0; len < 32; ++len)
		st->block[len] ^= 0x36;
	// начать внутреннее хэширование
	beltBlockSetZero(st->ls_in);
	beltBlockAddBitSizeU32(st->ls_in, 32);
	beltBlockSetZero(st->ls_in + 4);
	u32From(st->h_in, beltH(), 32);
	beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
	st->filled = 0;
	// сформировать key ^ opad [0x36 ^ 0x5C == 0x6A]
	for (; len--; )
		st->block[len] ^= 0x6A;
	// начать внешнее хэширование [будет хэшироваться ровно два блока]
	beltBlockSetZero(st->ls_out);
	beltBlockAddBitSizeU32(st->ls_out, 32 * 2);
	beltBlockSetZero(st->ls_out + 4);
	u32From(st->h_out, beltH(), 32);
	beltCompr2(st->ls_out + 4, st->h_out, (u32*)st->block, st->stack);
}